

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemFinalize(Mem *pMem,FuncDef *pFunc)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  sqlite3_context ctx;
  MemValue local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  _func_void_void_ptr *p_Stack_58;
  sqlite3_context local_48;
  long local_10;
  
  local_48.pOut = (Mem *)&local_88;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.pVdbe = (Vdbe *)0x0;
  local_48.iOp = 0;
  local_48.isError = 0;
  local_48.argv[0] = (sqlite3_value *)0x0;
  p_Stack_58 = (_func_void_void_ptr *)0x0;
  uStack_68 = 0;
  local_60 = 0;
  local_88.r = 0.0;
  uStack_80 = 0;
  uStack_78 = 0x100000000;
  uStack_70 = pMem->db;
  local_48._41_7_ = 0;
  local_48.enc = uStack_70->enc;
  local_48.pFunc = pFunc;
  local_48.pMem = pMem;
  (*pFunc->xFinalize)(&local_48);
  if (0 < pMem->szMalloc) {
    sqlite3DbFreeNN(pMem->db,pMem->zMalloc);
  }
  uVar1 = uStack_78;
  pMem->xDel = p_Stack_58;
  pMem->szMalloc = (int)uStack_68;
  pMem->uTemp = uStack_68._4_4_;
  *(undefined4 *)&pMem->zMalloc = (undefined4)local_60;
  *(undefined4 *)((long)&pMem->zMalloc + 4) = local_60._4_4_;
  pMem->n = (int)uStack_78;
  pMem->flags = uStack_78._4_2_;
  pMem->enc = uStack_78._6_1_;
  pMem->eSubtype = uStack_78._7_1_;
  *(undefined4 *)&pMem->db = (undefined4)uStack_70;
  *(undefined4 *)((long)&pMem->db + 4) = uStack_70._4_4_;
  (pMem->u).nZero = local_88.nZero;
  *(undefined4 *)((long)&pMem->u + 4) = local_88.i._4_4_;
  *(undefined4 *)&pMem->z = (undefined4)uStack_80;
  *(undefined4 *)((long)&pMem->z + 4) = uStack_80._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return local_48.isError;
  }
  uStack_78 = uVar1;
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFinalize(Mem *pMem, FuncDef *pFunc){
  sqlite3_context ctx;
  Mem t;
  assert( pFunc!=0 );
  assert( pMem!=0 );
  assert( pMem->db!=0 );
  assert( pFunc->xFinalize!=0 );
  assert( (pMem->flags & MEM_Null)!=0 || pFunc==pMem->u.pDef );
  assert( sqlite3_mutex_held(pMem->db->mutex) );
  memset(&ctx, 0, sizeof(ctx));
  memset(&t, 0, sizeof(t));
  t.flags = MEM_Null;
  t.db = pMem->db;
  ctx.pOut = &t;
  ctx.pMem = pMem;
  ctx.pFunc = pFunc;
  ctx.enc = ENC(t.db);
  pFunc->xFinalize(&ctx); /* IMP: R-24505-23230 */
  assert( (pMem->flags & MEM_Dyn)==0 );
  if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
  memcpy(pMem, &t, sizeof(t));
  return ctx.isError;
}